

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request_queue_impl_qwqr.cpp
# Opt level: O0

void * foxxll::request_queue_impl_qwqr::worker(void *arg)

{
  bool bVar1;
  bool bVar2;
  value_type vVar3;
  __pid_t _Var4;
  reference pvVar5;
  request *prVar6;
  undefined4 extraout_var;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  __sighandler_t __handler_01;
  int iVar7;
  mutex_type *pmVar8;
  long *local_88;
  long *local_78;
  value_type local_64;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> local_60;
  request_ptr req_1;
  unique_lock<std::mutex> read_lock;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> local_38;
  request_ptr req;
  unique_lock<std::mutex> write_lock;
  bool write_phase;
  self *pthis;
  void *arg_local;
  
  bVar2 = true;
  while( true ) {
    do {
      tlx::Semaphore::wait((Semaphore *)((long)arg + 0xf0),(void *)0x1);
      if (bVar2) {
        pmVar8 = (mutex_type *)((long)arg + 8);
        std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&req,pmVar8);
        iVar7 = (int)pmVar8;
        bVar1 = std::__cxx11::
                list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                ::empty((list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                         *)((long)arg + 0x58));
        if (bVar1) {
          std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&req);
          tlx::Semaphore::signal((Semaphore *)((long)arg + 0xf0),iVar7,__handler);
          bVar2 = false;
        }
        else {
          pvVar5 = std::__cxx11::
                   list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                   ::front((list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                            *)((long)arg + 0x58));
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::CountingPtr
                    (&local_38,pvVar5);
          std::__cxx11::
          list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
          ::pop_front((list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                       *)((long)arg + 0x58));
          std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&req);
          prVar6 = tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::get(&local_38)
          ;
          if (prVar6 == (request *)0x0) {
            local_78 = (long *)0x0;
          }
          else {
            local_78 = (long *)__dynamic_cast(prVar6,&request::typeinfo,&serving_request::typeinfo,0
                                             );
          }
          (**(code **)(*local_78 + 0x58))();
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::~CountingPtr(&local_38)
          ;
        }
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&req);
      }
      else {
        pmVar8 = (mutex_type *)((long)arg + 0x30);
        std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&req_1,pmVar8);
        iVar7 = (int)pmVar8;
        bVar2 = std::__cxx11::
                list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                ::empty((list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                         *)((long)arg + 0x70));
        if (bVar2) {
          std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&req_1);
          tlx::Semaphore::signal((Semaphore *)((long)arg + 0xf0),iVar7,__handler_00);
        }
        else {
          pvVar5 = std::__cxx11::
                   list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                   ::front((list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                            *)((long)arg + 0x70));
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::CountingPtr
                    (&local_60,pvVar5);
          std::__cxx11::
          list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
          ::pop_front((list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                       *)((long)arg + 0x70));
          std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&req_1);
          prVar6 = tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::get(&local_60)
          ;
          if (prVar6 == (request *)0x0) {
            local_88 = (long *)0x0;
          }
          else {
            local_88 = (long *)__dynamic_cast(prVar6,&request::typeinfo,&serving_request::typeinfo,0
                                             );
          }
          (**(code **)(*local_88 + 0x58))();
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::~CountingPtr(&local_60)
          ;
        }
        bVar2 = true;
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&req_1);
      }
      vVar3 = shared_state<foxxll::request_queue_impl_worker::thread_state>::operator()
                        ((shared_state<foxxll::request_queue_impl_worker::thread_state> *)
                         ((long)arg + 0x88));
    } while (vVar3 != TERMINATING);
    iVar7 = 1;
    _Var4 = tlx::Semaphore::wait((Semaphore *)((long)arg + 0xf0),(void *)0x1);
    if (CONCAT44(extraout_var,_Var4) == 0) break;
    tlx::Semaphore::signal((Semaphore *)((long)arg + 0xf0),iVar7,__handler_01);
  }
  local_64 = TERMINATED;
  shared_state<foxxll::request_queue_impl_worker::thread_state>::set_to
            ((shared_state<foxxll::request_queue_impl_worker::thread_state> *)((long)arg + 0x88),
             &local_64);
  return (void *)0x0;
}

Assistant:

void* request_queue_impl_qwqr::worker(void* arg)
{
    self* pthis = static_cast<self*>(arg);

    bool write_phase = true;
    for ( ; ; )
    {
        pthis->sem_.wait();

        if (write_phase)
        {
            std::unique_lock<std::mutex> write_lock(pthis->write_mutex_);
            if (!pthis->write_queue_.empty())
            {
                request_ptr req = pthis->write_queue_.front();
                pthis->write_queue_.pop_front();

                write_lock.unlock();

                //assert(req->get_reference_count()) > 1);
                dynamic_cast<serving_request*>(req.get())->serve();
            }
            else
            {
                write_lock.unlock();

                pthis->sem_.signal();

                if (pthis->priority_op_ == WRITE)
                    write_phase = false;
            }

            if (pthis->priority_op_ == NONE || pthis->priority_op_ == READ)
                write_phase = false;
        }
        else
        {
            std::unique_lock<std::mutex> read_lock(pthis->read_mutex_);

            if (!pthis->read_queue_.empty())
            {
                request_ptr req = pthis->read_queue_.front();
                pthis->read_queue_.pop_front();

                read_lock.unlock();

                TLX_LOG << "queue: before serve request has "
                        << req->reference_count() << " references ";
                //assert(req->get_reference_count() > 1);
                dynamic_cast<serving_request*>(req.get())->serve();
                TLX_LOG << "queue: after serve request has "
                        << req->reference_count() << " references ";
            }
            else
            {
                read_lock.unlock();

                pthis->sem_.signal();

                if (pthis->priority_op_ == READ)
                    write_phase = true;
            }

            if (pthis->priority_op_ == NONE || pthis->priority_op_ == WRITE)
                write_phase = true;
        }

        // terminate if it has been requested and queues are empty
        if (pthis->thread_state_() == TERMINATING) {
            if (pthis->sem_.wait() == 0)
                break;
            else
                pthis->sem_.signal();
        }
    }

    pthis->thread_state_.set_to(TERMINATED);

#if FOXXLL_MSVC >= 1700 && FOXXLL_MSVC <= 1800
    // Workaround for deadlock bug in Visual C++ Runtime 2012 and 2013, see
    // request_queue_impl_worker.cpp. -tb
    ExitThread(nullptr);
#else
    return nullptr;
#endif
}